

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O0

ResourceBundle * __thiscall
icu_63::ResourceBundle::operator=(ResourceBundle *this,ResourceBundle *other)

{
  UResourceBundle *pUVar1;
  UErrorCode local_24;
  ResourceBundle *pRStack_20;
  UErrorCode status;
  ResourceBundle *other_local;
  ResourceBundle *this_local;
  
  if (this != other) {
    pRStack_20 = other;
    other_local = this;
    if (this->fResource != (UResourceBundle *)0x0) {
      ures_close_63(this->fResource);
      this->fResource = (UResourceBundle *)0x0;
    }
    if (this->fLocale != (Locale *)0x0) {
      if (this->fLocale != (Locale *)0x0) {
        (*(this->fLocale->super_UObject)._vptr_UObject[1])();
      }
      this->fLocale = (Locale *)0x0;
    }
    local_24 = U_ZERO_ERROR;
    if (pRStack_20->fResource == (UResourceBundle *)0x0) {
      this->fResource = (UResourceBundle *)0x0;
    }
    else {
      pUVar1 = ures_copyResb_63((UResourceBundle *)0x0,pRStack_20->fResource,&local_24);
      this->fResource = pUVar1;
    }
  }
  return this;
}

Assistant:

ResourceBundle& ResourceBundle::operator=(const ResourceBundle& other)
{
    if(this == &other) {
        return *this;
    }
    if(fResource != 0) {
        ures_close(fResource);
        fResource = NULL;
    }
    if (fLocale != NULL) {
        delete fLocale;
        fLocale = NULL;
    }
    UErrorCode status = U_ZERO_ERROR;
    if (other.fResource) {
        fResource = ures_copyResb(0, other.fResource, &status);
    } else {
        /* Copying a bad resource bundle */
        fResource = NULL;
    }
    return *this;
}